

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O3

void Map_NodeVecRemove(Map_NodeVec_t *p,Map_Node_t *Entry)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = p->nSize;
  if (0 < (long)iVar1) {
    uVar2 = 0;
    do {
      if (p->pArray[uVar2] == Entry) {
        if ((int)uVar2 + 1 < iVar1) {
          do {
            p->pArray[uVar2] = p->pArray[uVar2 + 1];
            uVar2 = uVar2 + 1;
          } while (iVar1 - 1U != uVar2);
        }
        p->nSize = iVar1 - 1U;
        return;
      }
      uVar2 = uVar2 + 1;
    } while ((long)iVar1 != uVar2);
  }
  __assert_fail("i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mapper/mapperVec.c"
                ,0x100,"void Map_NodeVecRemove(Map_NodeVec_t *, Map_Node_t *)");
}

Assistant:

void Map_NodeVecRemove( Map_NodeVec_t * p, Map_Node_t * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
}